

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  
  for (sVar9 = 0; sVar9 != n_commands; sVar9 = sVar9 + 1) {
    uVar11 = commands[sVar9].insert_len_;
    uVar13 = (ulong)uVar11;
    uVar12 = commands[sVar9].copy_len_;
    uVar2 = commands[sVar9].cmd_prefix_;
    bVar1 = cmd_depth[uVar2];
    uVar16 = *storage_ix;
    uVar4 = commands[sVar9].dist_extra_;
    uVar3 = commands[sVar9].dist_prefix_;
    *(ulong *)(storage + (uVar16 >> 3)) =
         (ulong)cmd_bits[uVar2] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
    uVar16 = bVar1 + uVar16;
    *storage_ix = uVar16;
    uVar14 = uVar11;
    if (5 < uVar13) {
      if (uVar11 < 0x82) {
        uVar14 = 0x1f;
        uVar18 = (uint)(uVar13 - 2);
        if (uVar18 != 0) {
          for (; uVar18 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        iVar10 = (uVar14 ^ 0xffffffe0) + 0x1f;
        uVar14 = (int)(uVar13 - 2 >> ((byte)iVar10 & 0x3f)) + iVar10 * 2 + 2;
      }
      else if (uVar11 < 0x842) {
        uVar14 = 0x1f;
        if (uVar11 - 0x42 != 0) {
          for (; uVar11 - 0x42 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar14 = (uVar14 ^ 0xffffffe0) + 0x2a;
      }
      else {
        uVar14 = 0x15;
        if (0x1841 < uVar11) {
          uVar14 = 0x17 - (uVar11 < 0x5842);
        }
      }
    }
    bVar1 = (byte)(uVar12 >> 0x18);
    uVar12 = uVar12 & 0x1ffffff;
    uVar18 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + uVar12;
    if (uVar18 < 10) {
      uVar7 = uVar18 + 0xfffe;
    }
    else if (uVar18 < 0x86) {
      uVar7 = 0x1f;
      uVar6 = (uint)((ulong)uVar18 - 6);
      if (uVar6 != 0) {
        for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      iVar10 = (uVar7 ^ 0xffffffe0) + 0x1f;
      uVar7 = (int)((ulong)uVar18 - 6 >> ((byte)iVar10 & 0x3f)) + iVar10 * 2 + 4;
    }
    else {
      uVar7 = 0x17;
      if (uVar18 < 0x846) {
        uVar7 = 0x1f;
        if (uVar18 - 0x46 != 0) {
          for (; uVar18 - 0x46 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = (uVar7 ^ 0xffffffe0) + 0x2c;
      }
    }
    uVar15 = (ulong)((uVar14 & 0xffff) << 2);
    iVar10 = *(int *)((long)kInsExtra + uVar15);
    uVar8 = (ulong)((uVar7 & 0xffff) << 2);
    iVar5 = *(int *)((long)kCopyExtra + uVar8);
    *(ulong *)(storage + (uVar16 >> 3)) =
         ((ulong)(uVar18 - *(int *)((long)kCopyBase + uVar8)) << ((byte)iVar10 & 0x3f) |
         (ulong)(uVar11 - *(int *)((long)kInsBase + uVar15))) << ((byte)uVar16 & 7) |
         (ulong)storage[uVar16 >> 3];
    uVar16 = (uint)(iVar10 + iVar5) + uVar16;
    *storage_ix = uVar16;
    uVar8 = start_pos;
    for (lVar17 = 0; -lVar17 != uVar13; lVar17 = lVar17 + -1) {
      bVar1 = lit_depth[input[uVar8 & mask]];
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)lit_bits[input[uVar8 & mask]] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      uVar16 = uVar16 + bVar1;
      *storage_ix = uVar16;
      uVar8 = uVar8 + 1;
    }
    if ((uVar12 != 0) && (0x7f < uVar2)) {
      uVar11 = uVar3 & 0x3ff;
      bVar1 = dist_depth[uVar11];
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)dist_bits[uVar11] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      uVar16 = bVar1 + uVar16;
      *storage_ix = uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)uVar4 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar16 + (uVar3 >> 10);
    }
    start_pos = (start_pos + uVar12) - lVar17;
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command* commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_ & 0x3FF;
      const uint32_t distnumextra = cmd.dist_prefix_ >> 10;
      const uint32_t distextra = cmd.dist_extra_;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}